

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O2

Bool IsValidColorCode(ctmbstr color)

{
  uint uVar1;
  Bool BVar2;
  void *pvVar3;
  Bool BVar4;
  long lVar5;
  
  uVar1 = prvTidytmbstrlen(color);
  if (uVar1 == 6) {
    BVar4 = yes;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      BVar2 = prvTidyIsDigit((int)color[lVar5]);
      if (BVar2 == no) {
        uVar1 = prvTidyToLower((int)color[lVar5]);
        pvVar3 = memchr("abcdef",uVar1,7);
        if (pvVar3 == (void *)0x0) goto LAB_0013d94b;
      }
    }
  }
  else {
LAB_0013d94b:
    BVar4 = no;
  }
  return BVar4;
}

Assistant:

static Bool IsValidColorCode(ctmbstr color)
{
    uint i;

    if (TY_(tmbstrlen)(color) != 6)
        return no;

    /* check if valid hex digits and letters */
    for (i = 0; i < 6; i++)
        if (!TY_(IsDigit)(color[i]) && !strchr("abcdef", TY_(ToLower)(color[i])))
            return no;

    return yes;
}